

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O0

string * license::test::generate_license
                   (string *__return_storage_ptr__,string *license_name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *other_args)

{
  unit_test_log_t *puVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  lazy_ostream *plVar5;
  string *psVar6;
  char *pcVar7;
  ostream *poVar8;
  size_type sVar9;
  const_reference pvVar10;
  value_type *a_pszFile;
  undefined4 local_5ac;
  basic_cstring<const_char> local_5a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_598;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  int local_550 [2];
  int sectionSize;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_538;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  SI_Error local_4ec;
  undefined1 local_4e8 [4];
  SI_Error rc;
  CSimpleIniA ini;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]> local_470;
  assertion_result local_450;
  basic_cstring<const_char> local_438;
  basic_cstring<const_char> local_428;
  undefined4 local_414;
  basic_cstring<const_char> local_410;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_400;
  basic_cstring<const_char> local_3d8;
  basic_cstring<const_char> local_3c8;
  string local_3b8 [36];
  int local_394;
  string local_390 [4];
  int retCode;
  ulong local_370;
  size_t i;
  stringstream ss;
  ostream local_358 [376];
  string local_1e0 [8];
  string license_fname_s;
  undefined1 local_1a0 [8];
  path license_fname;
  string license_name_norm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  assertion_result local_110;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  undefined1 local_d8 [8];
  path licenses_base;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[181],_const_char_(&)[181]> local_a8;
  assertion_result local_88;
  basic_cstring<const_char> local_70 [2];
  basic_cstring<const_char> local_50;
  undefined1 local_40 [8];
  path lcc_exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *other_args_local;
  string *license_name_local;
  
  lcc_exe.m_pathname.field_2._8_8_ = other_args;
  boost::filesystem::path::path
            ((path *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
            );
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_50,0x1e,local_70);
    bVar3 = boost::filesystem::is_regular_file((path *)local_40);
    boost::test_tools::assertion_result::assertion_result(&local_88,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_a8,plVar5,
               (char (*) [181])
               "License generator not found: /workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&licenses_base.m_pathname.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion
              (&local_88,&local_a8,(undefined1 *)((long)&licenses_base.m_pathname.field_2 + 8),0x1e,
               2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[181],_const_char_(&)[181]>::
    ~lazy_ostream_impl(&local_a8);
    boost::test_tools::assertion_result::~assertion_result(&local_88);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::filesystem::path::path
            ((path *)local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/Testing/Temporary/DEFAULT/licenses"
            );
  bVar3 = boost::filesystem::exists((path *)local_d8);
  if (!bVar3) {
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e8,0x21,&local_f8);
      bVar3 = boost::filesystem::create_directories((path *)local_d8);
      boost::test_tools::assertion_result::assertion_result(&local_110,bVar3);
      plVar5 = boost::unit_test::lazy_ostream::instance();
      psVar6 = boost::filesystem::path::string_abi_cxx11_((path *)local_d8);
      std::operator+(&local_150,"test folders created ",psVar6);
      boost::unit_test::operator<<(&local_130,plVar5,&local_150);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)((long)&license_name_norm.field_2 + 8),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7d);
      boost::test_tools::tt_detail::report_assertion
                (&local_110,&local_130,(undefined1 *)((long)&license_name_norm.field_2 + 8),0x21,2,1
                 ,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      boost::test_tools::assertion_result::~assertion_result(&local_110);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
  }
  bVar3 = boost::algorithm::ends_with<std::__cxx11::string,char[5]>
                    (license_name,(char (*) [5])0x47a0b2);
  if (bVar3) {
    std::__cxx11::string::string
              ((string *)(license_fname.m_pathname.field_2._M_local_buf + 8),(string *)license_name)
    ;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&license_fname.m_pathname.field_2 + 8),license_name,".lic");
  }
  boost::filesystem::path::path
            ((path *)((long)&license_fname_s.field_2 + 8),
             (string_type *)((long)&license_fname.m_pathname.field_2 + 8));
  boost::filesystem::operator/
            ((path *)local_1a0,(path *)local_d8,(path *)((long)&license_fname_s.field_2 + 8));
  boost::filesystem::path::~path((path *)((long)&license_fname_s.field_2 + 8));
  psVar6 = boost::filesystem::path::string_abi_cxx11_((path *)local_1a0);
  std::__cxx11::string::string(local_1e0,(string *)psVar6);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  remove(pcVar7);
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  poVar8 = std::operator<<(local_358,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
                          );
  std::operator<<(poVar8," license issue");
  poVar8 = std::operator<<(local_358," --primary-key ");
  std::operator<<(poVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/projects/DEFAULT/private_key.rsa"
                 );
  poVar8 = std::operator<<(local_358," --output-file-name ");
  std::operator<<(poVar8,local_1e0);
  poVar8 = std::operator<<(local_358," --project-folder ");
  std::operator<<(poVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/Testing/Temporary/DEFAULT"
                 );
  for (local_370 = 0; uVar2 = local_370,
      sVar9 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)lcc_exe.m_pathname.field_2._8_8_), uVar2 < sVar9; local_370 = local_370 + 1)
  {
    poVar8 = std::operator<<(local_358," ");
    pvVar10 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)lcc_exe.m_pathname.field_2._8_8_,local_370);
    std::operator<<(poVar8,(string *)pvVar10);
  }
  poVar8 = std::operator<<((ostream *)std::cout,"executing :");
  std::__cxx11::stringstream::str();
  poVar8 = std::operator<<(poVar8,local_390);
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_390);
  std::__cxx11::stringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  iVar4 = system(pcVar7);
  std::__cxx11::string::~string(local_3b8);
  local_394 = iVar4;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3c8,0x33,&local_3d8);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_400,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_410,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    local_414 = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_400,&local_410,0x33,2,2,&local_394,"retCode",&local_414,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_400);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_438);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_428,0x34,&local_438);
    bVar3 = boost::filesystem::exists((path *)local_1a0);
    boost::test_tools::assertion_result::assertion_result(&local_450,bVar3);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_470,plVar5,(char (*) [15])"license exists");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&ini.m_bStoreIsUtf8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion
              (&local_450,&local_470,&ini.m_bStoreIsUtf8,0x34,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[15],_const_char_(&)[15]>::
    ~lazy_ostream_impl(&local_470);
    boost::test_tools::assertion_result::~assertion_result(&local_450);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_4e8,false,
             false,false);
  a_pszFile = boost::filesystem::path::c_str((path *)local_1a0);
  local_4ec = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                        ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                         local_4e8,a_pszFile);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_500,0x37,&local_510);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_538,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&sectionSize,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    local_550[1] = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,SI_Error,int>
              (&local_538,&sectionSize,0x37,2,7,&local_4ec,"rc",local_550 + 1,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_538);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  local_550[0] = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                           ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                            local_4e8,"DEFAULT");
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_570);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_560,0x39,&local_570);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_598,plVar5,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    local_5ac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,int,int>
              (&local_598,&local_5a8,0x39,1,6,local_550,"sectionSize",&local_5ac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_598);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  psVar6 = boost::filesystem::path::string_abi_cxx11_((path *)local_1a0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar6);
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
            ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_4e8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  std::__cxx11::string::~string(local_1e0);
  boost::filesystem::path::~path((path *)local_1a0);
  std::__cxx11::string::~string((string *)(license_fname.m_pathname.field_2._M_local_buf + 8));
  boost::filesystem::path::~path((path *)local_d8);
  boost::filesystem::path::~path((path *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string generate_license(const string& license_name, const vector<string>& other_args) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}
	const string license_name_norm = boost::ends_with(license_name, ".lic") ? license_name : (license_name + ".lic");
	const fs::path license_fname(licenses_base / license_name_norm);
	const string license_fname_s = license_fname.string();
	remove(license_fname_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " license issue";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " --" PARAM_LICENSE_OUTPUT " " << license_fname_s;
	ss << " --" PARAM_PROJECT_FOLDER " " << LCC_TEST_LICENSES_PROJECT;

	for (size_t i = 0; i < other_args.size(); i++) {
		ss << " " << other_args[i];
	}
	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_REQUIRE_EQUAL(retCode, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(license_fname), "license exists");
	CSimpleIniA ini;
	const SI_Error rc = ini.LoadFile(license_fname.c_str());
	BOOST_REQUIRE_GE(rc, 0);
	const int sectionSize = ini.GetSectionSize(LCC_PROJECT_NAME);
	BOOST_CHECK_GT(sectionSize, 0);
	return license_fname.string();
}